

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O3

qpTestResult __thiscall
deqp::ShaderIntegerMixPrototypesCase::test(ShaderIntegerMixPrototypesCase *this)

{
  char *pcVar1;
  long lVar2;
  bool *pbVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  char *pcVar7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  byte bVar10;
  long lVar11;
  GLSLVersion version;
  GLint compileSuccess;
  char *strings [1];
  string code;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  GLchar infoLog [1000];
  int local_4a8;
  uint local_4a4;
  TestLog *local_4a0;
  long local_498;
  bool *local_490;
  string local_488;
  string local_468;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_448;
  key_type local_418 [31];
  
  local_4a0 = ((this->super_ShaderIntegerMixCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  iVar5 = (*((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  version = (this->super_ShaderIntegerMixCase).m_glslVersion;
  if ((this->super_ShaderIntegerMixCase).field_0x7c == '\x01') {
    bVar4 = glu::glslVersionIsES(version);
    version = GLSL_VERSION_330;
    if (bVar4) {
      version = GLSL_VERSION_300_ES;
    }
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_shader_integer_mix");
    if (!bVar4) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
    local_490 = (bool *)0x1b854fd;
  }
  else {
    if ((int)version < 2) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
    local_490 = ::glcts::fixed_sample_locations_values + 1;
  }
  uVar9 = CONCAT71((int7)((ulong)local_490 >> 8),1);
  lVar11 = 0;
  bVar10 = 1;
  local_498 = CONCAT44(extraout_var,iVar5);
  do {
    local_4a4 = (uint)uVar9;
    local_448._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_448._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_448._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_448._M_impl.super__Rb_tree_header._M_header;
    local_448._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_448._M_impl.super__Rb_tree_header._M_header._M_right =
         local_448._M_impl.super__Rb_tree_header._M_header._M_left;
    pcVar7 = glu::getGLSLVersionDeclaration(version);
    local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"VERSION_DECL","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_448,local_418);
    pcVar1 = (char *)pmVar8->_M_string_length;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar1,(ulong)pcVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418[0]._M_dataplus._M_p != &local_418[0].field_2) {
      operator_delete(local_418[0]._M_dataplus._M_p,local_418[0].field_2._M_allocated_capacity + 1);
    }
    local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"EXTENSION_ENABLE","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_448,local_418);
    pbVar3 = local_490;
    pcVar1 = (char *)pmVar8->_M_string_length;
    strlen(local_490);
    std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar1,(ulong)pbVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418[0]._M_dataplus._M_p != &local_418[0].field_2) {
      operator_delete(local_418[0]._M_dataplus._M_p,local_418[0].field_2._M_allocated_capacity + 1);
    }
    pcVar1 = test::shader_targets[lVar11].body;
    local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"BODY","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_448,local_418);
    pcVar7 = (char *)pmVar8->_M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar7,(ulong)pcVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418[0]._M_dataplus._M_p != &local_418[0].field_2) {
      operator_delete(local_418[0]._M_dataplus._M_p,local_418[0].field_2._M_allocated_capacity + 1);
    }
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_488,
               "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nvoid main()\n{\n\tmix(ivec2(1), ivec2(2), bvec2(true));\n\tmix(ivec3(1), ivec3(2), bvec3(true));\n\tmix(ivec4(1), ivec4(2), bvec4(true));\n\tmix(uvec2(1), uvec2(2), bvec2(true));\n\tmix(uvec3(1), uvec3(2), bvec3(true));\n\tmix(uvec4(1), uvec4(2), bvec4(true));\n\tmix(bvec2(1), bvec2(0), bvec2(true));\n\tmix(bvec3(1), bvec3(0), bvec3(true));\n\tmix(bvec4(1), bvec4(0), bvec4(true));\n\t${BODY}\n}\n"
               ,"");
    tcu::StringTemplate::StringTemplate((StringTemplate *)local_418,&local_488);
    tcu::StringTemplate::specialize
              (&local_468,(StringTemplate *)local_418,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_448);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    lVar2 = local_498;
    uVar6 = (**(code **)(local_498 + 0x3f0))(test::shader_targets[lVar11].target);
    local_488._M_dataplus._M_p = local_468._M_dataplus._M_p;
    (**(code **)(lVar2 + 0x12b8))(uVar6,1,&local_488);
    (**(code **)(lVar2 + 0x248))(uVar6);
    local_4a8 = 0;
    (**(code **)(lVar2 + 0xa70))(uVar6,0x8b81,&local_4a8);
    if (local_4a8 == 0) {
      (**(code **)(lVar2 + 0xa58))(uVar6,1000,0);
      tcu::TestLog::writeKernelSource(local_4a0,local_488._M_dataplus._M_p);
      tcu::TestLog::writeCompileInfo
                (local_4a0,"shader",::glcts::fixed_sample_locations_values + 1,false,
                 (char *)local_418);
      bVar10 = 0;
    }
    (**(code **)(lVar2 + 0x470))(uVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_448);
    lVar11 = 1;
    uVar9 = 0;
  } while ((local_4a4 & 1) != 0);
  return (uint)(~bVar10 & 1);
}

Assistant:

virtual qpTestResult test()
	{
		TestLog&			  log  = m_testCtx.getLog();
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;

		static const char source_template[] = "${VERSION_DECL}\n"
											  "${EXTENSION_ENABLE}\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "	mix(ivec2(1), ivec2(2), bvec2(true));\n"
											  "	mix(ivec3(1), ivec3(2), bvec3(true));\n"
											  "	mix(ivec4(1), ivec4(2), bvec4(true));\n"
											  "	mix(uvec2(1), uvec2(2), bvec2(true));\n"
											  "	mix(uvec3(1), uvec3(2), bvec3(true));\n"
											  "	mix(uvec4(1), uvec4(2), bvec4(true));\n"
											  "	mix(bvec2(1), bvec2(0), bvec2(true));\n"
											  "	mix(bvec3(1), bvec3(0), bvec3(true));\n"
											  "	mix(bvec4(1), bvec4(0), bvec4(true));\n"
											  "	${BODY}\n"
											  "}\n";

		static const struct
		{
			GLenum		target;
			const char* body;
		} shader_targets[] = {
			{ GL_VERTEX_SHADER, "gl_Position = vec4(0);" }, { GL_FRAGMENT_SHADER, "" },
		};

		glu::GLSLVersion v;
		const char*		 extension_enable;

		if (use_extension)
		{
			v				 = glslVersionIsES(m_glslVersion) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;
			extension_enable = "#extension GL_EXT_shader_integer_mix: enable";

			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
				return QP_TEST_RESULT_NOT_SUPPORTED;
		}
		else
		{
			v				 = m_glslVersion;
			extension_enable = "";

			if (m_glslVersion < glu::GLSL_VERSION_310_ES)
				return QP_TEST_RESULT_NOT_SUPPORTED;
		}

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(shader_targets); i++)
		{
			std::map<std::string, std::string> args;

			args["VERSION_DECL"]	 = glu::getGLSLVersionDeclaration(v);
			args["EXTENSION_ENABLE"] = extension_enable;
			args["BODY"]			 = shader_targets[i].body;

			std::string code = tcu::StringTemplate(source_template).specialize(args);

			GLuint		shader	 = gl.createShader(shader_targets[i].target);
			char const* strings[1] = { code.c_str() };
			gl.shaderSource(shader, 1, strings, 0);
			gl.compileShader(shader);

			GLint compileSuccess = 0;
			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compileSuccess);

			if (!compileSuccess)
			{
				GLchar infoLog[1000];

				gl.getShaderInfoLog(shader, sizeof(infoLog), NULL, infoLog);
				log.writeKernelSource(strings[0]);
				log.writeCompileInfo("shader", "", false, infoLog);

				pass = false;
			}

			gl.deleteShader(shader);
		}

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}